

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool __thiscall
QMainWindowLayout::restoreDockWidget(QMainWindowLayout *this,QDockWidget *dockwidget)

{
  bool bVar1;
  DockWidgetArea _t1;
  
  QLayout::addChildWidget((QLayout *)this,&dockwidget->super_QWidget);
  bVar1 = QDockAreaLayout::restoreDockWidget((QDockAreaLayout *)(this + 0x1a0),dockwidget);
  if (bVar1) {
    _t1 = dockWidgetArea(this,&dockwidget->super_QWidget);
    QDockWidget::dockLocationChanged(dockwidget,_t1);
    (**(code **)(*(long *)this + 0x70))(this);
  }
  return bVar1;
}

Assistant:

bool QMainWindowLayout::restoreDockWidget(QDockWidget *dockwidget)
{
    addChildWidget(dockwidget);
    if (!layoutState.dockAreaLayout.restoreDockWidget(dockwidget))
        return false;
    emit dockwidget->dockLocationChanged(dockWidgetArea(dockwidget));
    invalidate();
    return true;
}